

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_collation_needed
              (sqlite3 *db,void *pCollNeededArg,
              _func_void_void_ptr_sqlite3_ptr_int_char_ptr *xCollNeeded)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14dcf4);
  *(undefined8 *)(in_RDI + 0x170) = in_RDX;
  *(undefined8 *)(in_RDI + 0x178) = 0;
  *(undefined8 *)(in_RDI + 0x180) = in_RSI;
  sqlite3_mutex_leave((sqlite3_mutex *)0x14dd33);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_collation_needed(
  sqlite3 *db,
  void *pCollNeededArg,
  void(*xCollNeeded)(void*,sqlite3*,int eTextRep,const char*)
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  db->xCollNeeded = xCollNeeded;
  db->xCollNeeded16 = 0;
  db->pCollNeededArg = pCollNeededArg;
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}